

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O3

void okim6295_w(void *chip,UINT8 offset,UINT8 data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  long lVar6;
  code *UNRECOVERED_JUMPTABLE;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  undefined7 in_register_00000031;
  undefined8 uVar10;
  ulong uVar11;
  okim6295_state *info;
  char *pcVar12;
  uint uVar13;
  
  uVar8 = (uint)CONCAT71(in_register_00000031,offset);
  switch(CONCAT71(in_register_00000031,offset) & 0xffffffff) {
  case 0:
    if (*(short *)((long)chip + 0xe0) == -1) {
      if (-1 < (char)data) {
        bVar1 = data >> 3;
        lVar6 = 0x38;
        do {
          if ((bVar1 & 1) != 0) {
            *(undefined1 *)((long)chip + lVar6) = 0;
          }
          bVar1 = bVar1 >> 1;
          lVar6 = lVar6 + 0x30;
        } while (lVar6 != 0xf8);
        return;
      }
      uVar4 = (ushort)(data & 0x7f);
    }
    else {
      uVar7 = (ulong)(data >> 4);
      pcVar12 = (char *)((long)chip + 0x38);
      uVar11 = 0;
      do {
        if (((uVar7 & 1) != 0) && (*pcVar12 == '\0')) {
          uVar5 = (uint)*(short *)((long)chip + 0xe0);
          bVar1 = memory_raw_read_byte((okim6295_state *)chip,uVar5 * 8);
          bVar2 = memory_raw_read_byte((okim6295_state *)chip,uVar5 * 8 + 1);
          bVar3 = memory_raw_read_byte((okim6295_state *)chip,uVar5 * 8 + 2);
          uVar13 = (bVar1 & 3) << 0x10 | (uint)bVar2 << 8 | (uint)bVar3;
          bVar1 = memory_raw_read_byte((okim6295_state *)chip,uVar5 * 8 + 3);
          bVar2 = memory_raw_read_byte((okim6295_state *)chip,uVar5 * 8 + 4);
          bVar3 = memory_raw_read_byte((okim6295_state *)chip,uVar5 * 8 + 5);
          uVar8 = (bVar1 & 3) * 0x10000 + (uint)bVar2 * 0x100 | (uint)bVar3;
          iVar9 = uVar8 - uVar13;
          if (uVar8 < uVar13 || iVar9 == 0) {
            emu_logf((DEV_LOGGER *)((long)chip + 8),'\x04',
                     "Voice %u requested to play invalid sample %02x\n",uVar11 & 0xffffffff,
                     (ulong)uVar5);
            *pcVar12 = '\0';
          }
          else {
            *pcVar12 = '\x01';
            *(uint *)(pcVar12 + 4) = uVar13;
            pcVar12[8] = '\0';
            pcVar12[9] = '\0';
            pcVar12[10] = '\0';
            pcVar12[0xb] = '\0';
            *(int *)(pcVar12 + 0xc) = iVar9 * 2 + 2;
            oki_adpcm_reset((oki_adpcm_state *)(pcVar12 + -0x18));
            *(int *)(pcVar12 + 0x10) = volume_table[data & 0xf];
          }
        }
        uVar11 = uVar11 + 1;
        uVar7 = uVar7 >> 1;
        pcVar12 = pcVar12 + 0x30;
      } while (uVar11 != 4);
      uVar4 = 0xffff;
    }
    *(ushort *)((long)chip + 0xe0) = uVar4;
    break;
  case 8:
  case 9:
  case 10:
    *(UINT8 *)((long)chip + (ulong)(uVar8 & 3) + 0xf4) = data;
    break;
  case 0xb:
    *(UINT8 *)((long)chip + 0xf7) = data;
    uVar8 = *(uint *)((long)chip + 0xf4);
    *(uint *)((long)chip + 0xf0) = uVar8;
    if (*(code **)((long)chip + 0x108) != (code *)0x0) {
      uVar5 = 0x84;
      if (*(char *)((long)chip + 0xe8) == '\0') {
        uVar5 = 0xa5;
      }
      (**(code **)((long)chip + 0x108))
                (*(undefined8 *)((long)chip + 0x110),(ulong)uVar8 / (ulong)uVar5,
                 (ulong)uVar8 % (ulong)uVar5);
      UNRECOVERED_JUMPTABLE = *(code **)((long)chip + 0x108);
      if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
        uVar8 = 0x84;
        if (*(char *)((long)chip + 0xe8) == '\0') {
          uVar8 = 0xa5;
        }
        uVar10 = *(undefined8 *)((long)chip + 0x110);
        uVar5 = *(uint *)((long)chip + 0xf0) / uVar8;
        uVar7 = (ulong)*(uint *)((long)chip + 0xf0) % (ulong)uVar8;
        goto LAB_00166e06;
      }
    }
    break;
  case 0xc:
    *(UINT8 *)((long)chip + 0xe8) = data;
    UNRECOVERED_JUMPTABLE = *(code **)((long)chip + 0x108);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      uVar8 = 0x84;
      if (data == '\0') {
        uVar8 = 0xa5;
      }
      uVar10 = *(undefined8 *)((long)chip + 0x110);
      uVar5 = *(uint *)((long)chip + 0xf0) / uVar8;
      uVar7 = (ulong)*(uint *)((long)chip + 0xf0) % (ulong)uVar8;
LAB_00166e06:
      (*UNRECOVERED_JUMPTABLE)(uVar10,uVar5,uVar7);
      return;
    }
    break;
  case 0xe:
    *(UINT8 *)((long)chip + 0xea) = data;
    break;
  case 0xf:
    *(uint *)((long)chip + 0xe4) = (uint)data << 0x12;
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    *(UINT8 *)((long)chip + (ulong)(uVar8 & 3) + 0xeb) = data;
  }
  return;
}

Assistant:

static void okim6295_w(void* chip, UINT8 offset, UINT8 data)
{
	okim6295_state *info = (okim6295_state *)chip;
	
	switch(offset)
	{
	case 0x00:
		okim6295_write_command(info, data);
		break;
	case 0x08:
	case 0x09:
	case 0x0A:
		info->clock_buffer[offset & 0x03] = data;
		break;
	case 0x0B:
		info->clock_buffer[offset & 0x03] = data;
		okim6295_set_clock(chip, 0);	// refresh clock from clock_buffer
		if (info->SmpRateFunc != NULL)
			info->SmpRateFunc(info->SmpRateData, okim6295_get_rate(chip));
		break;
	case 0x0C:
		okim6295_set_pin7(info, data);
		break;
	case 0x0E:	// NMK112 bank switch enable
		info->nmk_mode = data;
		break;
	case 0x0F:
		okim6295_set_bank_base(info, data << 18);
		break;
	case 0x10:
	case 0x11:
	case 0x12:
	case 0x13:
		info->nmk_bank[offset & 0x03] = data;
		break;
	}
	
	return;
}